

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

container_t *
convert_to_bitset_or_array_container(run_container_t *rc,int32_t card,uint8_t *resulttype)

{
  int iVar1;
  uint8_t uVar2;
  array_container_t *paVar3;
  long lVar4;
  ushort uVar5;
  ushort uVar6;
  int rlepos_1;
  long lVar7;
  
  if (card < 0x1001) {
    paVar3 = array_container_create_given_capacity(card);
    paVar3->cardinality = 0;
    iVar1 = rc->n_runs;
    lVar7 = 0;
    for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
      uVar5 = rc->runs[lVar4].value;
      uVar6 = rc->runs[lVar4].length + uVar5;
      lVar7 = (long)(int)lVar7;
      for (; uVar5 <= uVar6; uVar5 = uVar5 + 1) {
        paVar3->cardinality = (int32_t)(lVar7 + 1);
        paVar3->array[lVar7] = uVar5;
        lVar7 = lVar7 + 1;
      }
    }
    uVar2 = '\x02';
    if ((int)lVar7 != card) {
      __assert_fail("card == answer->cardinality",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x2de6,
                    "container_t *convert_to_bitset_or_array_container(run_container_t *, int32_t, uint8_t *)"
                   );
    }
  }
  else {
    paVar3 = (array_container_t *)bitset_container_create();
    for (lVar7 = 0; lVar7 < rc->n_runs; lVar7 = lVar7 + 1) {
      bitset_set_lenrange((uint64_t *)paVar3->array,(uint)rc->runs[lVar7].value,
                          (uint)rc->runs[lVar7].length);
    }
    paVar3->cardinality = card;
    uVar2 = '\x01';
  }
  *resulttype = uVar2;
  return paVar3;
}

Assistant:

container_t *convert_to_bitset_or_array_container(
    run_container_t *rc, int32_t card,
    uint8_t *resulttype
){
    if (card <= DEFAULT_MAX_SIZE) {
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int rlepos = 0; rlepos < rc->n_runs; ++rlepos) {
            uint16_t run_start = rc->runs[rlepos].value;
            uint16_t run_end = run_start + rc->runs[rlepos].length;
            for (uint16_t run_value = run_start; run_value <= run_end;
                 ++run_value) {
                answer->array[answer->cardinality++] = run_value;
            }
        }
        assert(card == answer->cardinality);
        *resulttype = ARRAY_CONTAINER_TYPE;
        //run_container_free(r);
        return answer;
    }
    bitset_container_t *answer = bitset_container_create();
    for (int rlepos = 0; rlepos < rc->n_runs; ++rlepos) {
        uint16_t run_start = rc->runs[rlepos].value;
        bitset_set_lenrange(answer->words, run_start, rc->runs[rlepos].length);
    }
    answer->cardinality = card;
    *resulttype = BITSET_CONTAINER_TYPE;
    //run_container_free(r);
    return answer;
}